

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LocalGraph.cpp
# Opt level: O0

void __thiscall
wasm::LocalGraphFlower::flowBackFromStartOfBlock
          (LocalGraphFlower *this,FlowBlock *block,Index index,
          vector<wasm::LocalGet_*,_std::allocator<wasm::LocalGet_*>_> *gets)

{
  value_type pFVar1;
  pointer ppFVar2;
  bool bVar3;
  reference ppFVar4;
  reference ppFVar5;
  reference ppLVar6;
  SmallSetBase<wasm::LocalSet_*,_2UL,_wasm::OrderedFixedStorage<wasm::LocalSet_*,_2UL>,_std::set<wasm::LocalSet_*,_std::less<wasm::LocalSet_*>,_std::allocator<wasm::LocalSet_*>_>_>
  *pSVar7;
  pointer ppVar8;
  LocalGet *local_e8;
  LocalGet *get_1;
  const_iterator __end6;
  const_iterator __begin6;
  vector<wasm::LocalGet_*,_std::allocator<wasm::LocalGet_*>_> *__range6;
  Index *local_c0;
  pair<unsigned_int,_wasm::LocalSet_*> *local_b8;
  __normal_iterator<std::pair<unsigned_int,_wasm::LocalSet_*>_*,_std::vector<std::pair<unsigned_int,_wasm::LocalSet_*>,_std::allocator<std::pair<unsigned_int,_wasm::LocalSet_*>_>_>_>
  local_b0;
  __normal_iterator<std::pair<unsigned_int,_wasm::LocalSet_*>_*,_std::vector<std::pair<unsigned_int,_wasm::LocalSet_*>,_std::allocator<std::pair<unsigned_int,_wasm::LocalSet_*>_>_>_>
  local_a8;
  __normal_iterator<std::pair<unsigned_int,_wasm::LocalSet_*>_*,_std::vector<std::pair<unsigned_int,_wasm::LocalSet_*>,_std::allocator<std::pair<unsigned_int,_wasm::LocalSet_*>_>_>_>
  lastSet;
  FlowBlock *pred;
  iterator __end4;
  iterator __begin4;
  vector<wasm::LocalGraphFlower::FlowBlock_*,_std::allocator<wasm::LocalGraphFlower::FlowBlock_*>_>
  *__range4;
  LocalGet *local_78;
  LocalGet *get;
  const_iterator __end5;
  const_iterator __begin5;
  vector<wasm::LocalGet_*,_std::allocator<wasm::LocalGet_*>_> *__range5;
  FlowBlock *curr;
  undefined1 local_40 [8];
  vector<wasm::LocalGraphFlower::FlowBlock_*,_std::allocator<wasm::LocalGraphFlower::FlowBlock_*>_>
  work;
  vector<wasm::LocalGet_*,_std::allocator<wasm::LocalGet_*>_> *gets_local;
  FlowBlock *pFStack_18;
  Index index_local;
  FlowBlock *block_local;
  LocalGraphFlower *this_local;
  
  work.
  super__Vector_base<wasm::LocalGraphFlower::FlowBlock_*,_std::allocator<wasm::LocalGraphFlower::FlowBlock_*>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)gets;
  gets_local._4_4_ = index;
  pFStack_18 = block;
  block_local = (FlowBlock *)this;
  std::
  vector<wasm::LocalGraphFlower::FlowBlock_*,_std::allocator<wasm::LocalGraphFlower::FlowBlock_*>_>
  ::vector((vector<wasm::LocalGraphFlower::FlowBlock_*,_std::allocator<wasm::LocalGraphFlower::FlowBlock_*>_>
            *)local_40);
  std::
  vector<wasm::LocalGraphFlower::FlowBlock_*,_std::allocator<wasm::LocalGraphFlower::FlowBlock_*>_>
  ::push_back((vector<wasm::LocalGraphFlower::FlowBlock_*,_std::allocator<wasm::LocalGraphFlower::FlowBlock_*>_>
               *)local_40,&stack0xffffffffffffffe8);
  while (bVar3 = std::
                 vector<wasm::LocalGraphFlower::FlowBlock_*,_std::allocator<wasm::LocalGraphFlower::FlowBlock_*>_>
                 ::empty((vector<wasm::LocalGraphFlower::FlowBlock_*,_std::allocator<wasm::LocalGraphFlower::FlowBlock_*>_>
                          *)local_40), ((bVar3 ^ 0xffU) & 1) != 0) {
    ppFVar4 = std::
              vector<wasm::LocalGraphFlower::FlowBlock_*,_std::allocator<wasm::LocalGraphFlower::FlowBlock_*>_>
              ::back((vector<wasm::LocalGraphFlower::FlowBlock_*,_std::allocator<wasm::LocalGraphFlower::FlowBlock_*>_>
                      *)local_40);
    pFVar1 = *ppFVar4;
    std::
    vector<wasm::LocalGraphFlower::FlowBlock_*,_std::allocator<wasm::LocalGraphFlower::FlowBlock_*>_>
    ::pop_back((vector<wasm::LocalGraphFlower::FlowBlock_*,_std::allocator<wasm::LocalGraphFlower::FlowBlock_*>_>
                *)local_40);
    bVar3 = std::
            vector<wasm::LocalGraphFlower::FlowBlock_*,_std::allocator<wasm::LocalGraphFlower::FlowBlock_*>_>
            ::empty(&pFVar1->in);
    ppFVar2 = work.
              super__Vector_base<wasm::LocalGraphFlower::FlowBlock_*,_std::allocator<wasm::LocalGraphFlower::FlowBlock_*>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage;
    if (bVar3) {
      if (pFVar1 == this->entryFlowBlock) {
        __end5 = std::vector<wasm::LocalGet_*,_std::allocator<wasm::LocalGet_*>_>::begin
                           ((vector<wasm::LocalGet_*,_std::allocator<wasm::LocalGet_*>_> *)
                            work.
                            super__Vector_base<wasm::LocalGraphFlower::FlowBlock_*,_std::allocator<wasm::LocalGraphFlower::FlowBlock_*>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage);
        get = (LocalGet *)
              std::vector<wasm::LocalGet_*,_std::allocator<wasm::LocalGet_*>_>::end
                        ((vector<wasm::LocalGet_*,_std::allocator<wasm::LocalGet_*>_> *)ppFVar2);
        while (bVar3 = __gnu_cxx::operator!=
                                 (&__end5,(__normal_iterator<wasm::LocalGet_*const_*,_std::vector<wasm::LocalGet_*,_std::allocator<wasm::LocalGet_*>_>_>
                                           *)&get), bVar3) {
          ppLVar6 = __gnu_cxx::
                    __normal_iterator<wasm::LocalGet_*const_*,_std::vector<wasm::LocalGet_*,_std::allocator<wasm::LocalGet_*>_>_>
                    ::operator*(&__end5);
          local_78 = *ppLVar6;
          pSVar7 = &std::
                    unordered_map<wasm::LocalGet_*,_wasm::SmallSet<wasm::LocalSet_*,_2UL>,_std::hash<wasm::LocalGet_*>,_std::equal_to<wasm::LocalGet_*>,_std::allocator<std::pair<wasm::LocalGet_*const,_wasm::SmallSet<wasm::LocalSet_*,_2UL>_>_>_>
                    ::operator[](this->getSetsMap,&local_78)->
                    super_SmallSetBase<wasm::LocalSet_*,_2UL,_wasm::OrderedFixedStorage<wasm::LocalSet_*,_2UL>,_std::set<wasm::LocalSet_*,_std::less<wasm::LocalSet_*>,_std::allocator<wasm::LocalSet_*>_>_>
          ;
          __range4 = (vector<wasm::LocalGraphFlower::FlowBlock_*,_std::allocator<wasm::LocalGraphFlower::FlowBlock_*>_>
                      *)0x0;
          SmallSetBase<wasm::LocalSet_*,_2UL,_wasm::OrderedFixedStorage<wasm::LocalSet_*,_2UL>,_std::set<wasm::LocalSet_*,_std::less<wasm::LocalSet_*>,_std::allocator<wasm::LocalSet_*>_>_>
          ::insert(pSVar7,(LocalSet **)&__range4);
          __gnu_cxx::
          __normal_iterator<wasm::LocalGet_*const_*,_std::vector<wasm::LocalGet_*,_std::allocator<wasm::LocalGet_*>_>_>
          ::operator++(&__end5);
        }
      }
    }
    else {
      __end4 = std::
               vector<wasm::LocalGraphFlower::FlowBlock_*,_std::allocator<wasm::LocalGraphFlower::FlowBlock_*>_>
               ::begin(&pFVar1->in);
      pred = (FlowBlock *)
             std::
             vector<wasm::LocalGraphFlower::FlowBlock_*,_std::allocator<wasm::LocalGraphFlower::FlowBlock_*>_>
             ::end(&pFVar1->in);
      while (bVar3 = __gnu_cxx::operator!=
                               (&__end4,(__normal_iterator<wasm::LocalGraphFlower::FlowBlock_**,_std::vector<wasm::LocalGraphFlower::FlowBlock_*,_std::allocator<wasm::LocalGraphFlower::FlowBlock_*>_>_>
                                         *)&pred), bVar3) {
        ppFVar5 = __gnu_cxx::
                  __normal_iterator<wasm::LocalGraphFlower::FlowBlock_**,_std::vector<wasm::LocalGraphFlower::FlowBlock_*,_std::allocator<wasm::LocalGraphFlower::FlowBlock_*>_>_>
                  ::operator*(&__end4);
        lastSet._M_current = (pair<unsigned_int,_wasm::LocalSet_*> *)*ppFVar5;
        if (((FlowBlock *)lastSet._M_current)->lastTraversedIteration != this->currentIteration) {
          ((FlowBlock *)lastSet._M_current)->lastTraversedIteration = this->currentIteration;
          local_b0._M_current =
               (pair<unsigned_int,_wasm::LocalSet_*> *)
               std::
               vector<std::pair<unsigned_int,_wasm::LocalSet_*>,_std::allocator<std::pair<unsigned_int,_wasm::LocalSet_*>_>_>
               ::begin(&((FlowBlock *)lastSet._M_current)->lastSets);
          local_b8 = (pair<unsigned_int,_wasm::LocalSet_*> *)
                     std::
                     vector<std::pair<unsigned_int,_wasm::LocalSet_*>,_std::allocator<std::pair<unsigned_int,_wasm::LocalSet_*>_>_>
                     ::end((vector<std::pair<unsigned_int,_wasm::LocalSet_*>,_std::allocator<std::pair<unsigned_int,_wasm::LocalSet_*>_>_>
                            *)&lastSet._M_current[3].second);
          local_c0 = (Index *)((long)&gets_local + 4);
          local_a8 = std::
                     find_if<__gnu_cxx::__normal_iterator<std::pair<unsigned_int,wasm::LocalSet*>*,std::vector<std::pair<unsigned_int,wasm::LocalSet*>,std::allocator<std::pair<unsigned_int,wasm::LocalSet*>>>>,wasm::LocalGraphFlower::flowBackFromStartOfBlock(wasm::LocalGraphFlower::FlowBlock*,unsigned_int,std::vector<wasm::LocalGet*,std::allocator<wasm::LocalGet*>>const&)::_lambda(std::pair<unsigned_int,wasm::LocalSet*>&)_1_>
                               (local_b0,(__normal_iterator<std::pair<unsigned_int,_wasm::LocalSet_*>_*,_std::vector<std::pair<unsigned_int,_wasm::LocalSet_*>,_std::allocator<std::pair<unsigned_int,_wasm::LocalSet_*>_>_>_>
                                          )local_b8,(anon_class_8_1_a81517f2_for__M_pred)local_c0);
          __range6 = (vector<wasm::LocalGet_*,_std::allocator<wasm::LocalGet_*>_> *)
                     std::
                     vector<std::pair<unsigned_int,_wasm::LocalSet_*>,_std::allocator<std::pair<unsigned_int,_wasm::LocalSet_*>_>_>
                     ::end((vector<std::pair<unsigned_int,_wasm::LocalSet_*>,_std::allocator<std::pair<unsigned_int,_wasm::LocalSet_*>_>_>
                            *)&lastSet._M_current[3].second);
          bVar3 = __gnu_cxx::operator!=
                            (&local_a8,
                             (__normal_iterator<std::pair<unsigned_int,_wasm::LocalSet_*>_*,_std::vector<std::pair<unsigned_int,_wasm::LocalSet_*>,_std::allocator<std::pair<unsigned_int,_wasm::LocalSet_*>_>_>_>
                              *)&__range6);
          ppFVar2 = work.
                    super__Vector_base<wasm::LocalGraphFlower::FlowBlock_*,_std::allocator<wasm::LocalGraphFlower::FlowBlock_*>_>
                    ._M_impl.super__Vector_impl_data._M_end_of_storage;
          if (bVar3) {
            __end6 = std::vector<wasm::LocalGet_*,_std::allocator<wasm::LocalGet_*>_>::begin
                               ((vector<wasm::LocalGet_*,_std::allocator<wasm::LocalGet_*>_> *)
                                work.
                                super__Vector_base<wasm::LocalGraphFlower::FlowBlock_*,_std::allocator<wasm::LocalGraphFlower::FlowBlock_*>_>
                                ._M_impl.super__Vector_impl_data._M_end_of_storage);
            get_1 = (LocalGet *)
                    std::vector<wasm::LocalGet_*,_std::allocator<wasm::LocalGet_*>_>::end
                              ((vector<wasm::LocalGet_*,_std::allocator<wasm::LocalGet_*>_> *)
                               ppFVar2);
            while (bVar3 = __gnu_cxx::operator!=
                                     (&__end6,(__normal_iterator<wasm::LocalGet_*const_*,_std::vector<wasm::LocalGet_*,_std::allocator<wasm::LocalGet_*>_>_>
                                               *)&get_1), bVar3) {
              ppLVar6 = __gnu_cxx::
                        __normal_iterator<wasm::LocalGet_*const_*,_std::vector<wasm::LocalGet_*,_std::allocator<wasm::LocalGet_*>_>_>
                        ::operator*(&__end6);
              local_e8 = *ppLVar6;
              pSVar7 = &std::
                        unordered_map<wasm::LocalGet_*,_wasm::SmallSet<wasm::LocalSet_*,_2UL>,_std::hash<wasm::LocalGet_*>,_std::equal_to<wasm::LocalGet_*>,_std::allocator<std::pair<wasm::LocalGet_*const,_wasm::SmallSet<wasm::LocalSet_*,_2UL>_>_>_>
                        ::operator[](this->getSetsMap,&local_e8)->
                        super_SmallSetBase<wasm::LocalSet_*,_2UL,_wasm::OrderedFixedStorage<wasm::LocalSet_*,_2UL>,_std::set<wasm::LocalSet_*,_std::less<wasm::LocalSet_*>,_std::allocator<wasm::LocalSet_*>_>_>
              ;
              ppVar8 = __gnu_cxx::
                       __normal_iterator<std::pair<unsigned_int,_wasm::LocalSet_*>_*,_std::vector<std::pair<unsigned_int,_wasm::LocalSet_*>,_std::allocator<std::pair<unsigned_int,_wasm::LocalSet_*>_>_>_>
                       ::operator->(&local_a8);
              SmallSetBase<wasm::LocalSet_*,_2UL,_wasm::OrderedFixedStorage<wasm::LocalSet_*,_2UL>,_std::set<wasm::LocalSet_*,_std::less<wasm::LocalSet_*>,_std::allocator<wasm::LocalSet_*>_>_>
              ::insert(pSVar7,&ppVar8->second);
              __gnu_cxx::
              __normal_iterator<wasm::LocalGet_*const_*,_std::vector<wasm::LocalGet_*,_std::allocator<wasm::LocalGet_*>_>_>
              ::operator++(&__end6);
            }
          }
          else {
            std::
            vector<wasm::LocalGraphFlower::FlowBlock_*,_std::allocator<wasm::LocalGraphFlower::FlowBlock_*>_>
            ::push_back((vector<wasm::LocalGraphFlower::FlowBlock_*,_std::allocator<wasm::LocalGraphFlower::FlowBlock_*>_>
                         *)local_40,(value_type *)&lastSet);
          }
        }
        __gnu_cxx::
        __normal_iterator<wasm::LocalGraphFlower::FlowBlock_**,_std::vector<wasm::LocalGraphFlower::FlowBlock_*,_std::allocator<wasm::LocalGraphFlower::FlowBlock_*>_>_>
        ::operator++(&__end4);
      }
    }
  }
  this->currentIteration = this->currentIteration + 1;
  std::
  vector<wasm::LocalGraphFlower::FlowBlock_*,_std::allocator<wasm::LocalGraphFlower::FlowBlock_*>_>
  ::~vector((vector<wasm::LocalGraphFlower::FlowBlock_*,_std::allocator<wasm::LocalGraphFlower::FlowBlock_*>_>
             *)local_40);
  return;
}

Assistant:

void flowBackFromStartOfBlock(FlowBlock* block,
                                Index index,
                                const std::vector<LocalGet*>& gets) {
    std::vector<FlowBlock*> work; // TODO: UniqueDeferredQueue
    work.push_back(block);
    // Note that we may need to revisit the later parts of this initial
    // block, if we are in a loop, so don't mark it as seen.
    while (!work.empty()) {
      auto* curr = work.back();
      work.pop_back();
      // We have gone through this block; now we must handle flowing to
      // the inputs.
      if (curr->in.empty()) {
        if (curr == entryFlowBlock) {
          // These receive a param or zero init value.
          for (auto* get : gets) {
            getSetsMap[get].insert(nullptr);
          }
        }
      } else {
        for (auto* pred : curr->in) {
          if (pred->lastTraversedIteration == currentIteration) {
            // We've already seen pred in this iteration.
            continue;
          }
          pred->lastTraversedIteration = currentIteration;
          auto lastSet = std::find_if(pred->lastSets.begin(),
                                      pred->lastSets.end(),
                                      [&](std::pair<Index, LocalSet*>& value) {
                                        return value.first == index;
                                      });
          if (lastSet != pred->lastSets.end()) {
            // There is a set here, apply it, and stop the flow.
            // TODO: If we find a computed get, apply its sets and stop? That
            //       could help but it requires more info on FlowBlock.
            for (auto* get : gets) {
              getSetsMap[get].insert(lastSet->second);
            }
          } else {
            // Keep on flowing.
            work.push_back(pred);
          }
        }
      }
    }

    // Bump the current iteration for the next time we are called.
    currentIteration++;
  }